

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMvMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  NodeRef *pNVar12;
  AABBNodeMB4D *node1;
  ulong uVar13;
  ulong unaff_RBP;
  size_t mask;
  ulong uVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  bool bVar20;
  byte bVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  ulong local_a58;
  undefined1 local_a18 [16];
  ulong local_a08;
  ulong local_a00;
  ulong local_9f8;
  ulong local_9f0;
  ulong local_9e8;
  NodeRef *local_9e0;
  Scene *local_9d8;
  NodeRef *local_9d0;
  RTCFilterFunctionNArguments args;
  float local_8c8 [4];
  undefined1 local_8b8 [16];
  float local_8a8 [4];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  RTCHitN local_868 [16];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint uStack_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  auVar23 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar53 = ZEXT1664(auVar23);
  auVar24 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar54 = ZEXT1664(auVar24);
  auVar25 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar55 = ZEXT1664(auVar25);
  auVar23 = vmulss_avx512f(auVar23,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar24 = vmulss_avx512f(auVar24,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar26._0_4_ = auVar23._0_4_;
  auVar26._4_4_ = auVar26._0_4_;
  auVar26._8_4_ = auVar26._0_4_;
  auVar26._12_4_ = auVar26._0_4_;
  auVar37._0_4_ = auVar24._0_4_;
  auVar37._4_4_ = auVar37._0_4_;
  auVar37._8_4_ = auVar37._0_4_;
  auVar37._12_4_ = auVar37._0_4_;
  auVar23 = vmulss_avx512f(auVar25,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar25._0_4_ = auVar23._0_4_;
  auVar25._4_4_ = auVar25._0_4_;
  auVar25._8_4_ = auVar25._0_4_;
  auVar25._12_4_ = auVar25._0_4_;
  local_9e8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_9f0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_9f8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_a00 = local_9e8 ^ 0x10;
  local_a08 = local_9f0 ^ 0x10;
  auVar23 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar56 = ZEXT1664(auVar23);
  uVar17 = local_9f8 ^ 0x10;
  auVar23 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar57 = ZEXT1664(auVar23);
  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar58 = ZEXT1664(auVar23);
  auVar24 = vxorps_avx512vl(auVar26,auVar23);
  auVar59 = ZEXT1664(auVar24);
  auVar24 = vxorps_avx512vl(auVar37,auVar23);
  auVar60 = ZEXT1664(auVar24);
  auVar23 = vxorps_avx512vl(auVar25,auVar23);
  auVar61 = ZEXT1664(auVar23);
  auVar23 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar62 = ZEXT1664(auVar23);
  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar63 = ZEXT1664(auVar23);
  auVar23 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar64 = ZEXT1664(auVar23);
  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar65 = ZEXT1664(auVar23);
  pNVar12 = stack + 1;
  do {
    local_9d0 = pNVar12;
    if (local_9d0 == stack) break;
    local_9e0 = local_9d0 + -1;
    sVar15 = local_9d0[-1].ptr;
    do {
      if ((sVar15 & 8) == 0) {
        uVar13 = sVar15 & 0xfffffffffffffff0;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar36._4_4_ = uVar1;
        auVar36._0_4_ = uVar1;
        auVar36._8_4_ = uVar1;
        auVar36._12_4_ = uVar1;
        auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + local_9e8),auVar36,
                                  *(undefined1 (*) [16])(uVar13 + 0x20 + local_9e8));
        auVar24 = vfmadd213ps_avx512vl(auVar23,auVar53._0_16_,auVar59._0_16_);
        auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + local_9f0),auVar36,
                                  *(undefined1 (*) [16])(uVar13 + 0x20 + local_9f0));
        auVar25 = vmaxps_avx512vl(auVar56._0_16_,auVar24);
        auVar24 = vfmadd213ps_avx512vl(auVar23,auVar54._0_16_,auVar60._0_16_);
        auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + local_9f8),auVar36,
                                  *(undefined1 (*) [16])(uVar13 + 0x20 + local_9f8));
        auVar23 = vfmadd213ps_avx512vl(auVar23,auVar55._0_16_,auVar61._0_16_);
        auVar23 = vmaxps_avx(auVar24,auVar23);
        auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + local_a00),auVar36,
                                  *(undefined1 (*) [16])(uVar13 + 0x20 + local_a00));
        auVar23 = vmaxps_avx(auVar25,auVar23);
        auVar25 = vfmadd213ps_avx512vl(auVar24,auVar53._0_16_,auVar59._0_16_);
        auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + local_a08),auVar36,
                                  *(undefined1 (*) [16])(uVar13 + 0x20 + local_a08));
        auVar25 = vminps_avx512vl(auVar57._0_16_,auVar25);
        auVar26 = vfmadd213ps_avx512vl(auVar24,auVar54._0_16_,auVar60._0_16_);
        auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + uVar17),auVar36,
                                  *(undefined1 (*) [16])(uVar13 + 0x20 + uVar17));
        auVar24 = vfmadd213ps_avx512vl(auVar24,auVar55._0_16_,auVar61._0_16_);
        auVar24 = vminps_avx(auVar26,auVar24);
        auVar24 = vminps_avx(auVar25,auVar24);
        uVar6 = vcmpps_avx512vl(auVar23,auVar24,2);
        bVar21 = (byte)uVar6;
        if (((uint)sVar15 & 7) == 6) {
          uVar6 = vcmpps_avx512vl(auVar36,*(undefined1 (*) [16])(uVar13 + 0xf0),1);
          uVar7 = vcmpps_avx512vl(auVar36,*(undefined1 (*) [16])(uVar13 + 0xe0),0xd);
          bVar21 = (byte)uVar6 & (byte)uVar7 & bVar21;
        }
        unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),(uint)bVar21);
      }
      if ((sVar15 & 8) == 0) {
        if (unaff_RBP == 0) {
          uVar46 = 4;
        }
        else {
          uVar14 = sVar15 & 0xfffffffffffffff0;
          lVar18 = 0;
          for (uVar13 = unaff_RBP; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
            lVar18 = lVar18 + 1;
          }
          for (uVar13 = unaff_RBP - 1 & unaff_RBP; sVar15 = *(size_t *)(uVar14 + lVar18 * 8),
              uVar13 != 0; uVar13 = uVar13 - 1 & uVar13) {
            local_9e0->ptr = sVar15;
            local_9e0 = local_9e0 + 1;
            lVar18 = 0;
            for (uVar16 = uVar13; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
              lVar18 = lVar18 + 1;
            }
          }
          uVar46 = 0;
        }
      }
      else {
        uVar46 = 6;
      }
    } while (uVar46 == 0);
    if (uVar46 == 6) {
      uVar13 = (ulong)((uint)sVar15 & 0xf);
      uVar46 = 0;
      uVar14 = uVar13 - 8;
      bVar19 = uVar13 != 8;
      if (bVar19) {
        uVar16 = sVar15 & 0xfffffffffffffff0;
        uVar13 = 0;
        do {
          lVar18 = uVar13 * 0x140;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar28._4_4_ = uVar1;
          auVar28._0_4_ = uVar1;
          auVar28._8_4_ = uVar1;
          auVar28._12_4_ = uVar1;
          auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x90 + lVar18),auVar28,
                                    *(undefined1 (*) [16])(uVar16 + lVar18));
          auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xa0 + lVar18),auVar28,
                                    *(undefined1 (*) [16])(uVar16 + 0x10 + lVar18));
          auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xb0 + lVar18),auVar28,
                                    *(undefined1 (*) [16])(uVar16 + 0x20 + lVar18));
          auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xc0 + lVar18),auVar28,
                                    *(undefined1 (*) [16])(uVar16 + 0x30 + lVar18));
          auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xd0 + lVar18),auVar28,
                                    *(undefined1 (*) [16])(uVar16 + 0x40 + lVar18));
          auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xe0 + lVar18),auVar28,
                                    *(undefined1 (*) [16])(uVar16 + 0x50 + lVar18));
          auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xf0 + lVar18),auVar28,
                                    *(undefined1 (*) [16])(uVar16 + 0x60 + lVar18));
          auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x100 + lVar18),auVar28,
                                    *(undefined1 (*) [16])(uVar16 + 0x70 + lVar18));
          auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x110 + lVar18),auVar28,
                                    *(undefined1 (*) [16])(uVar16 + 0x80 + lVar18));
          auVar23 = vsubps_avx(auVar30,auVar23);
          auVar24 = vsubps_avx(auVar29,auVar24);
          auVar25 = vsubps_avx(auVar31,auVar25);
          auVar26 = vsubps_avx(auVar26,auVar30);
          auVar37 = vsubps_avx(auVar37,auVar29);
          auVar36 = vsubps_avx(auVar36,auVar31);
          auVar32._0_4_ = auVar24._0_4_ * auVar36._0_4_;
          auVar32._4_4_ = auVar24._4_4_ * auVar36._4_4_;
          auVar32._8_4_ = auVar24._8_4_ * auVar36._8_4_;
          auVar32._12_4_ = auVar24._12_4_ * auVar36._12_4_;
          local_898 = vfmsub231ps_fma(auVar32,auVar37,auVar25);
          auVar33._0_4_ = auVar25._0_4_ * auVar26._0_4_;
          auVar33._4_4_ = auVar25._4_4_ * auVar26._4_4_;
          auVar33._8_4_ = auVar25._8_4_ * auVar26._8_4_;
          auVar33._12_4_ = auVar25._12_4_ * auVar26._12_4_;
          local_888 = vfmsub231ps_fma(auVar33,auVar36,auVar23);
          auVar34._0_4_ = auVar23._0_4_ * auVar37._0_4_;
          auVar34._4_4_ = auVar23._4_4_ * auVar37._4_4_;
          auVar34._8_4_ = auVar23._8_4_ * auVar37._8_4_;
          auVar34._12_4_ = auVar23._12_4_ * auVar37._12_4_;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar35._4_4_ = uVar1;
          auVar35._0_4_ = uVar1;
          auVar35._8_4_ = uVar1;
          auVar35._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar50._4_4_ = uVar1;
          auVar50._0_4_ = uVar1;
          auVar50._8_4_ = uVar1;
          auVar50._12_4_ = uVar1;
          fVar39 = *(float *)(ray + k * 4 + 0x60);
          auVar51._4_4_ = fVar39;
          auVar51._0_4_ = fVar39;
          auVar51._8_4_ = fVar39;
          auVar51._12_4_ = fVar39;
          uVar1 = *(undefined4 *)(ray + k * 4);
          auVar27._4_4_ = uVar1;
          auVar27._0_4_ = uVar1;
          auVar27._8_4_ = uVar1;
          auVar27._12_4_ = uVar1;
          auVar27 = vsubps_avx512vl(auVar30,auVar27);
          local_878 = vfmsub231ps_fma(auVar34,auVar26,auVar24);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar30._4_4_ = uVar1;
          auVar30._0_4_ = uVar1;
          auVar30._8_4_ = uVar1;
          auVar30._12_4_ = uVar1;
          auVar28 = vsubps_avx512vl(auVar29,auVar30);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar29._4_4_ = uVar1;
          auVar29._0_4_ = uVar1;
          auVar29._8_4_ = uVar1;
          auVar29._12_4_ = uVar1;
          auVar29 = vsubps_avx512vl(auVar31,auVar29);
          auVar30 = vmulps_avx512vl(auVar50,auVar29);
          auVar31 = vfmsub231ps_avx512vl(auVar30,auVar28,auVar51);
          auVar30 = vmulps_avx512vl(auVar51,auVar27);
          auVar32 = vfmsub231ps_avx512vl(auVar30,auVar29,auVar35);
          auVar30 = vmulps_avx512vl(auVar35,auVar28);
          auVar33 = vfmsub231ps_avx512vl(auVar30,auVar27,auVar50);
          auVar52._0_4_ = fVar39 * local_878._0_4_;
          auVar52._4_4_ = fVar39 * local_878._4_4_;
          auVar52._8_4_ = fVar39 * local_878._8_4_;
          auVar52._12_4_ = fVar39 * local_878._12_4_;
          auVar30 = vfmadd231ps_fma(auVar52,local_888,auVar50);
          auVar30 = vfmadd231ps_fma(auVar30,local_898,auVar35);
          auVar34 = vandps_avx512vl(auVar30,auVar63._0_16_);
          auVar35 = vandps_avx512vl(auVar30,auVar58._0_16_);
          auVar36 = vmulps_avx512vl(auVar36,auVar33);
          auVar37 = vfmadd231ps_avx512vl(auVar36,auVar32,auVar37);
          auVar26 = vfmadd231ps_avx512vl(auVar37,auVar31,auVar26);
          uVar46 = auVar35._0_4_;
          auVar45._0_4_ = (float)(uVar46 ^ auVar26._0_4_);
          uVar47 = auVar35._4_4_;
          auVar45._4_4_ = (float)(uVar47 ^ auVar26._4_4_);
          uVar48 = auVar35._8_4_;
          auVar45._8_4_ = (float)(uVar48 ^ auVar26._8_4_);
          uVar49 = auVar35._12_4_;
          auVar45._12_4_ = (float)(uVar49 ^ auVar26._12_4_);
          auVar25 = vmulps_avx512vl(auVar25,auVar33);
          auVar24 = vfmadd231ps_avx512vl(auVar25,auVar24,auVar32);
          auVar23 = vfmadd231ps_avx512vl(auVar24,auVar23,auVar31);
          auVar24._0_4_ = (float)(uVar46 ^ auVar23._0_4_);
          auVar24._4_4_ = (float)(uVar47 ^ auVar23._4_4_);
          auVar24._8_4_ = (float)(uVar48 ^ auVar23._8_4_);
          auVar24._12_4_ = (float)(uVar49 ^ auVar23._12_4_);
          auVar23 = auVar64._0_16_;
          uVar6 = vcmpps_avx512vl(auVar45,auVar23,5);
          uVar7 = vcmpps_avx512vl(auVar24,auVar23,5);
          uVar8 = vcmpps_avx512vl(auVar30,auVar23,4);
          auVar23._0_4_ = auVar24._0_4_ + auVar45._0_4_;
          auVar23._4_4_ = auVar24._4_4_ + auVar45._4_4_;
          auVar23._8_4_ = auVar24._8_4_ + auVar45._8_4_;
          auVar23._12_4_ = auVar24._12_4_ + auVar45._12_4_;
          uVar9 = vcmpps_avx512vl(auVar23,auVar34,2);
          bVar21 = (byte)uVar6 & (byte)uVar7 & (byte)uVar8 & (byte)uVar9;
          if (bVar21 != 0) {
            auVar44._0_4_ = local_878._0_4_ * auVar29._0_4_;
            auVar44._4_4_ = local_878._4_4_ * auVar29._4_4_;
            auVar44._8_4_ = local_878._8_4_ * auVar29._8_4_;
            auVar44._12_4_ = local_878._12_4_ * auVar29._12_4_;
            auVar23 = vfmadd213ps_fma(auVar28,local_888,auVar44);
            auVar23 = vfmadd213ps_fma(auVar27,local_898,auVar23);
            auVar43._0_4_ = (float)(uVar46 ^ auVar23._0_4_);
            auVar43._4_4_ = (float)(uVar47 ^ auVar23._4_4_);
            auVar43._8_4_ = (float)(uVar48 ^ auVar23._8_4_);
            auVar43._12_4_ = (float)(uVar49 ^ auVar23._12_4_);
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar31._4_4_ = uVar1;
            auVar31._0_4_ = uVar1;
            auVar31._8_4_ = uVar1;
            auVar31._12_4_ = uVar1;
            auVar23 = vmulps_avx512vl(auVar34,auVar31);
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar11._4_4_ = uVar1;
            auVar11._0_4_ = uVar1;
            auVar11._8_4_ = uVar1;
            auVar11._12_4_ = uVar1;
            auVar25 = vmulps_avx512vl(auVar34,auVar11);
            uVar6 = vcmpps_avx512vl(auVar43,auVar25,2);
            uVar7 = vcmpps_avx512vl(auVar23,auVar43,1);
            bVar21 = (byte)uVar6 & (byte)uVar7 & bVar21;
            if (bVar21 != 0) {
              local_9d8 = context->scene;
              auVar23 = vrcp14ps_avx512vl(auVar34);
              auVar25 = vfnmadd213ps_avx512vl(auVar34,auVar23,auVar65._0_16_);
              auVar23 = vfmadd132ps_fma(auVar25,auVar23,auVar23);
              fVar39 = auVar23._0_4_;
              fVar40 = auVar23._4_4_;
              fVar41 = auVar23._8_4_;
              fVar42 = auVar23._12_4_;
              local_8a8[0] = fVar39 * auVar43._0_4_;
              local_8a8[1] = fVar40 * auVar43._4_4_;
              local_8a8[2] = fVar41 * auVar43._8_4_;
              local_8a8[3] = fVar42 * auVar43._12_4_;
              local_8c8[0] = fVar39 * auVar45._0_4_;
              local_8c8[1] = fVar40 * auVar45._4_4_;
              local_8c8[2] = fVar41 * auVar45._8_4_;
              local_8c8[3] = fVar42 * auVar45._12_4_;
              local_8b8._0_4_ = fVar39 * auVar24._0_4_;
              local_8b8._4_4_ = fVar40 * auVar24._4_4_;
              local_8b8._8_4_ = fVar41 * auVar24._8_4_;
              local_8b8._12_4_ = fVar42 * auVar24._12_4_;
              local_a58 = (ulong)bVar21;
              do {
                auVar23 = auVar64._0_16_;
                uVar10 = 0;
                for (uVar22 = local_a58; (uVar22 & 1) == 0;
                    uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                  uVar10 = uVar10 + 1;
                }
                pGVar4 = (local_9d8->geometries).items
                         [*(uint *)(lVar18 + uVar16 + 0x120 + uVar10 * 4)].ptr;
                if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  local_a58 = local_a58 ^ 1L << (uVar10 & 0x3f);
                  bVar20 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar20 = false;
                }
                else {
                  uVar22 = (ulong)(uint)((int)uVar10 * 4);
                  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
                  uVar2 = *(undefined4 *)((long)local_8c8 + uVar22);
                  local_838._4_4_ = uVar2;
                  local_838._0_4_ = uVar2;
                  local_838._8_4_ = uVar2;
                  local_838._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_8b8 + uVar22);
                  local_828._4_4_ = uVar2;
                  local_828._0_4_ = uVar2;
                  local_828._8_4_ = uVar2;
                  local_828._12_4_ = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_8a8 + uVar22);
                  args.context = context->user;
                  local_808 = vpbroadcastd_avx512vl();
                  uVar2 = *(undefined4 *)(lVar18 + uVar16 + 0x130 + uVar22);
                  local_818._4_4_ = uVar2;
                  local_818._0_4_ = uVar2;
                  local_818._8_4_ = uVar2;
                  local_818._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_898 + uVar22);
                  uVar3 = *(undefined4 *)(local_888 + uVar22);
                  local_858._4_4_ = uVar3;
                  local_858._0_4_ = uVar3;
                  local_858._8_4_ = uVar3;
                  local_858._12_4_ = uVar3;
                  uVar3 = *(undefined4 *)(local_878 + uVar22);
                  local_848._4_4_ = uVar3;
                  local_848._0_4_ = uVar3;
                  local_848._8_4_ = uVar3;
                  local_848._12_4_ = uVar3;
                  local_868[0] = (RTCHitN)(char)uVar2;
                  local_868[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_868[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_868[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_868[4] = (RTCHitN)(char)uVar2;
                  local_868[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_868[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_868[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_868[8] = (RTCHitN)(char)uVar2;
                  local_868[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_868[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_868[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_868[0xc] = (RTCHitN)(char)uVar2;
                  local_868[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_868[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_868[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  vpcmpeqd_avx2(ZEXT1632(local_808),ZEXT1632(local_808));
                  uStack_7f4 = (args.context)->instID[0];
                  local_7f8 = uStack_7f4;
                  uStack_7f0 = uStack_7f4;
                  uStack_7ec = uStack_7f4;
                  uStack_7e8 = (args.context)->instPrimID[0];
                  uStack_7e4 = uStack_7e8;
                  uStack_7e0 = uStack_7e8;
                  uStack_7dc = uStack_7e8;
                  auVar24 = vmovdqa64_avx512vl(auVar62._0_16_);
                  local_a18 = vmovdqa64_avx512vl(auVar62._0_16_);
                  args.valid = (int *)local_a18;
                  args.geometryUserPtr = pGVar4->userPtr;
                  args.hit = local_868;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar4->occlusionFilterN)(&args);
                  }
                  uVar22 = vptestmd_avx512vl(local_a18,local_a18);
                  if ((uVar22 & 0xf) == 0) {
                    bVar20 = true;
                  }
                  else {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var5)(&args);
                    }
                    uVar22 = vptestmd_avx512vl(local_a18,local_a18);
                    uVar22 = uVar22 & 0xf;
                    auVar25 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar20 = (bool)((byte)uVar22 & 1);
                    auVar38._0_4_ =
                         (uint)bVar20 * auVar25._0_4_ | (uint)!bVar20 * *(int *)(args.ray + 0x80);
                    bVar20 = (bool)((byte)(uVar22 >> 1) & 1);
                    auVar38._4_4_ =
                         (uint)bVar20 * auVar25._4_4_ | (uint)!bVar20 * *(int *)(args.ray + 0x84);
                    bVar20 = (bool)((byte)(uVar22 >> 2) & 1);
                    auVar38._8_4_ =
                         (uint)bVar20 * auVar25._8_4_ | (uint)!bVar20 * *(int *)(args.ray + 0x88);
                    bVar20 = SUB81(uVar22 >> 3,0);
                    auVar38._12_4_ =
                         (uint)bVar20 * auVar25._12_4_ | (uint)!bVar20 * *(int *)(args.ray + 0x8c);
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar38;
                    bVar20 = (byte)uVar22 == 0;
                  }
                  if (bVar20) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar1;
                    local_a58 = local_a58 ^ 1L << (uVar10 & 0x3f);
                  }
                  auVar53 = ZEXT1664(auVar53._0_16_);
                  auVar54 = ZEXT1664(auVar54._0_16_);
                  auVar55 = ZEXT1664(auVar55._0_16_);
                  auVar56 = ZEXT1664(auVar56._0_16_);
                  auVar57 = ZEXT1664(auVar57._0_16_);
                  auVar25 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar58 = ZEXT1664(auVar25);
                  auVar59 = ZEXT1664(auVar59._0_16_);
                  auVar60 = ZEXT1664(auVar60._0_16_);
                  auVar61 = ZEXT1664(auVar61._0_16_);
                  auVar24 = vmovdqa64_avx512vl(auVar24);
                  auVar62 = ZEXT1664(auVar24);
                  auVar24 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar63 = ZEXT1664(auVar24);
                  auVar23 = vxorps_avx512vl(auVar23,auVar23);
                  auVar64 = ZEXT1664(auVar23);
                  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar65 = ZEXT1664(auVar23);
                }
                if (!bVar20) {
                  uVar46 = 0;
                  if (bVar19) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    uVar46 = 1;
                  }
                  goto LAB_00765285;
                }
              } while (local_a58 != 0);
            }
          }
          uVar46 = 0;
          uVar13 = uVar13 + 1;
          bVar19 = uVar13 < uVar14;
        } while (uVar13 != uVar14);
      }
    }
LAB_00765285:
    pNVar12 = local_9e0;
  } while ((uVar46 & 3) == 0);
  return local_9d0 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }